

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O3

void anurbs::TypeRegistry<anurbs::Model>::register_type<anurbs::BrepLoop>(bool no_exception)

{
  TypeEntryBase<anurbs::Model> *pTVar1;
  iterator iVar2;
  runtime_error *this;
  TypeEntryBase<anurbs::Model> *pTVar3;
  mapped_type *pmVar4;
  string type;
  key_type local_38;
  
  local_38.field_2._M_allocated_capacity = 0x706f6f4c70657242;
  local_38._M_string_length = 8;
  local_38.field_2._M_local_buf[8] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
                  *)s_registry_abi_cxx11_,&local_38);
  if (iVar2._M_node == (_Base_ptr)(s_registry_abi_cxx11_ + 8)) {
    pTVar3 = (TypeEntryBase<anurbs::Model> *)operator_new(8);
    pTVar3->_vptr_TypeEntryBase = (_func_int **)&PTR__TypeEntryBase_003733b8;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
                           *)s_registry_abi_cxx11_,&local_38);
    pTVar1 = (pmVar4->_M_t).
             super___uniq_ptr_impl<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_anurbs::TypeEntryBase<anurbs::Model>_*,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>
             .super__Head_base<0UL,_anurbs::TypeEntryBase<anurbs::Model>_*,_false>._M_head_impl;
    (pmVar4->_M_t).
    super___uniq_ptr_impl<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_anurbs::TypeEntryBase<anurbs::Model>_*,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>
    .super__Head_base<0UL,_anurbs::TypeEntryBase<anurbs::Model>_*,_false>._M_head_impl = pTVar3;
    if (pTVar1 != (TypeEntryBase<anurbs::Model> *)0x0) {
      (*pTVar1->_vptr_TypeEntryBase[1])();
    }
  }
  else if (!no_exception) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Entity already registered");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void register_type(bool no_exception)
    {
        const std::string type = TData::type_name();

        if (s_registry.find(type) != s_registry.end()) {
            if (no_exception) {
                return;
            }
            throw std::runtime_error("Entity already registered");
        }

        s_registry[type] = new_<TypeEntry<TData, TModel>>();
    }